

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::MILSpec::Value_BlobFileValue::MergePartialFromCodedStream
          (Value_BlobFileValue *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  string *psVar6;
  ulong uVar7;
  
LAB_00257b18:
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00257b3b;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00257b3b:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar7 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar4 | uVar7;
    }
    uVar4 = (uint32)uVar7;
    if ((uVar7 & 0x100000000) == 0) {
LAB_00257bbb:
      if (uVar4 == 0) {
        return true;
      }
      if ((uVar4 & 7) == 4) {
        return true;
      }
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
LAB_00257bd4:
      if (bVar3 == false) {
        return false;
      }
      goto LAB_00257b18;
    }
    uVar5 = (uint)(uVar7 >> 3) & 0x1fffffff;
    if (uVar5 == 2) {
      if ((char)uVar7 != '\x10') goto LAB_00257bbb;
      bVar3 = google::protobuf::io::CodedInputStream::ReadVarint64(input,&this->offset_);
      goto LAB_00257bd4;
    }
    if ((uVar5 != 1) || ((char)uVar7 != '\n')) goto LAB_00257bbb;
    psVar6 = mutable_filename_abi_cxx11_(this);
    bVar3 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar6);
    if (!bVar3) {
      return false;
    }
    psVar6 = (this->filename_).ptr_;
    bVar3 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                      ((psVar6->_M_dataplus)._M_p,(int)psVar6->_M_string_length,PARSE,
                       "CoreML.Specification.MILSpec.Value.BlobFileValue.fileName");
    if (!bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool Value_BlobFileValue::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.MILSpec.Value.BlobFileValue)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string fileName = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_filename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->filename().data(), this->filename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.MILSpec.Value.BlobFileValue.fileName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 offset = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &offset_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.MILSpec.Value.BlobFileValue)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.MILSpec.Value.BlobFileValue)
  return false;
#undef DO_
}